

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

int fio_glob_match(fio_str_info_s pat,fio_str_info_s ch)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte *pbVar7;
  bool bVar8;
  byte bVar9;
  long lVar10;
  byte *pbVar11;
  long lVar12;
  byte *pbVar13;
  byte *in_stack_00000010;
  byte *in_stack_00000018;
  long in_stack_00000028;
  byte *in_stack_00000030;
  byte *local_48;
  byte *local_40;
  byte *local_38;
  
  if (in_stack_00000028 != 0) {
    local_38 = (byte *)0x0;
    local_40 = (byte *)0x0;
    local_48 = in_stack_00000030;
    pbVar11 = in_stack_00000010;
    lVar10 = in_stack_00000028;
    do {
      pbVar13 = in_stack_00000030 + 1;
      bVar2 = *in_stack_00000030;
      pbVar7 = in_stack_00000018 + 1;
      bVar6 = *in_stack_00000018;
      lVar12 = lVar10 + -1;
      in_stack_00000010 = pbVar11 + -1;
      if (bVar6 < 0x5b) {
        if (bVar6 == 0x2a) {
          in_stack_00000028 = lVar10;
          lVar12 = lVar10;
          pbVar13 = in_stack_00000030;
          local_48 = in_stack_00000030;
          local_40 = in_stack_00000010;
          local_38 = pbVar7;
          if (in_stack_00000010 == (byte *)0x0) {
            return 1;
          }
        }
        else if (bVar6 != 0x3f) goto LAB_0010d0d3;
      }
      else if (bVar6 == 0x5b) {
        pbVar11 = pbVar7 + (*pbVar7 == 0x5e) + 1;
        bVar6 = pbVar7[*pbVar7 == 0x5e];
        bVar8 = false;
        do {
          bVar9 = bVar6;
          bVar5 = bVar6;
          bVar4 = *pbVar11;
          if (*pbVar11 == 0x2d) {
            bVar3 = pbVar11[1];
            bVar4 = 0x2d;
            if (bVar3 != 0x5d) {
              pbVar1 = pbVar11 + 2;
              pbVar11 = pbVar11 + 2;
              bVar9 = bVar3;
              if (bVar6 < bVar3) {
                bVar9 = bVar6;
              }
              bVar5 = bVar3;
              bVar4 = *pbVar1;
              if (bVar3 < bVar6) {
                bVar5 = bVar6;
              }
            }
          }
          bVar6 = bVar4;
          bVar8 = (bool)(bVar8 | (bVar2 <= bVar5 && bVar9 <= bVar2));
          pbVar11 = pbVar11 + 1;
        } while (bVar6 != 0x5d);
        if (bVar8 == (*pbVar7 == 0x5e)) goto LAB_0010d18f;
        in_stack_00000010 = pbVar7 + ((long)in_stack_00000010 - (long)pbVar11);
        pbVar7 = pbVar11;
      }
      else {
        if (bVar6 == 0x5c) {
          pbVar7 = in_stack_00000018 + 2;
          bVar6 = in_stack_00000018[1];
          in_stack_00000010 = pbVar11 + -2;
        }
LAB_0010d0d3:
        if (bVar2 != bVar6) {
LAB_0010d18f:
          if (local_38 == (byte *)0x0) {
            return 0;
          }
          in_stack_00000028 = in_stack_00000028 + -1;
          in_stack_00000010 = local_40;
          pbVar7 = local_38;
          lVar12 = in_stack_00000028;
          pbVar13 = local_48 + 1;
          local_48 = local_48 + 1;
        }
      }
      pbVar11 = in_stack_00000010;
      in_stack_00000018 = pbVar7;
      lVar10 = lVar12;
      in_stack_00000030 = pbVar13;
    } while (lVar12 != 0);
  }
  return (uint)(in_stack_00000010 == (byte *)0x0);
}

Assistant:

static int fio_glob_match(fio_str_info_s pat, fio_str_info_s ch) {
  /* adapted and rewritten, with thankfulness, from the code at:
   * https://github.com/opnfv/kvmfornfv/blob/master/kernel/lib/glob.c
   *
   * Original version's copyright:
   * Copyright 2015 Open Platform for NFV Project, Inc. and its contributors
   * Under the MIT license.
   */

  /*
   * Backtrack to previous * on mismatch and retry starting one
   * character later in the string.  Because * matches all characters,
   * there's never a need to backtrack multiple levels.
   */
  uint8_t *back_pat = NULL, *back_str = (uint8_t *)ch.data;
  size_t back_pat_len = 0, back_str_len = ch.len;

  /*
   * Loop over each token (character or class) in pat, matching
   * it against the remaining unmatched tail of str.  Return false
   * on mismatch, or true after matching the trailing nul bytes.
   */
  while (ch.len) {
    uint8_t c = *(uint8_t *)ch.data++;
    uint8_t d = *(uint8_t *)pat.data++;
    ch.len--;
    pat.len--;

    switch (d) {
    case '?': /* Wildcard: anything goes */
      break;

    case '*':       /* Any-length wildcard */
      if (!pat.len) /* Optimize trailing * case */
        return 1;
      back_pat = (uint8_t *)pat.data;
      back_pat_len = pat.len;
      back_str = (uint8_t *)--ch.data; /* Allow zero-length match */
      back_str_len = ++ch.len;
      break;

    case '[': { /* Character class */
      uint8_t match = 0, inverted = (*(uint8_t *)pat.data == '^');
      uint8_t *cls = (uint8_t *)pat.data + inverted;
      uint8_t a = *cls++;

      /*
       * Iterate over each span in the character class.
       * A span is either a single character a, or a
       * range a-b.  The first span may begin with ']'.
       */
      do {
        uint8_t b = a;

        if (cls[0] == '-' && cls[1] != ']') {
          b = cls[1];

          cls += 2;
          if (a > b) {
            uint8_t tmp = a;
            a = b;
            b = tmp;
          }
        }
        match |= (a <= c && c <= b);
      } while ((a = *cls++) != ']');

      if (match == inverted)
        goto backtrack;
      pat.len -= cls - (uint8_t *)pat.data;
      pat.data = (char *)cls;

    } break;
    case '\\':
      d = *(uint8_t *)pat.data++;
      pat.len--;
    /* fallthrough */
    default: /* Literal character */
      if (c == d)
        break;
    backtrack:
      if (!back_pat)
        return 0; /* No point continuing */
      /* Try again from last *, one character later in str. */
      pat.data = (char *)back_pat;
      ch.data = (char *)++back_str;
      ch.len = --back_str_len;
      pat.len = back_pat_len;
    }
  }
  return !ch.len && !pat.len;
}